

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL_mock::GLCompiledProgram::addUniqueUniform
          (GLCompiledProgram *this,ShaderSpecUniform *newUniform)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pGVar2;
  size_t __n;
  pointer pcVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  vector<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>
  *this_00;
  pointer __rhs;
  bool bVar7;
  bool bVar8;
  string local_80;
  GLCompiledProgram *local_60;
  GLShaderUniform local_58;
  
  __rhs = (this->uniforms).
          super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pGVar2 = (this->uniforms).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = this;
  do {
    bVar7 = __rhs == pGVar2;
    if (bVar7) {
LAB_002978d6:
      this_00 = &local_60->uniforms;
      paVar1 = &local_58.name.field_2;
      pcVar3 = (newUniform->name)._M_dataplus._M_p;
      local_58.name._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar3,pcVar3 + (newUniform->name)._M_string_length);
      local_58.type = newUniform->type;
      local_58.isSet = false;
      std::
      vector<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>
      ::emplace_back<polyscope::render::backend_openGL_mock::GLShaderUniform>(this_00,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_58.name._M_dataplus._M_p);
      }
      return;
    }
    __n = (__rhs->name)._M_string_length;
    if (__n == (newUniform->name)._M_string_length) {
      if (__n == 0) {
        bVar8 = true;
      }
      else {
        iVar4 = bcmp((__rhs->name)._M_dataplus._M_p,(newUniform->name)._M_dataplus._M_p,__n);
        bVar8 = iVar4 == 0;
      }
    }
    else {
      bVar8 = false;
    }
    if (bVar8) {
      if (__rhs->type != newUniform->type) {
        std::operator+(&local_58.name,"uniform ",&__rhs->name);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_58);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_80.field_2._M_allocated_capacity = *psVar6;
          local_80.field_2._8_8_ = plVar5[3];
        }
        else {
          local_80.field_2._M_allocated_capacity = *psVar6;
          local_80._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_80._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        exception(&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.name._M_dataplus._M_p != &local_58.name.field_2) {
          operator_delete(local_58.name._M_dataplus._M_p);
        }
      }
      if (bVar8) {
        if (!bVar7) {
          return;
        }
        goto LAB_002978d6;
      }
    }
    __rhs = __rhs + 1;
  } while( true );
}

Assistant:

void GLCompiledProgram::addUniqueUniform(ShaderSpecUniform newUniform) {
  for (GLShaderUniform& u : uniforms) {
    if (u.name == newUniform.name) {

      // if it occurs twice, confirm that the occurences match
      if (u.type != newUniform.type) exception("uniform " + u.name + " appears twice in program with different types");

      return;
    }
  }
  uniforms.push_back(GLShaderUniform{newUniform.name, newUniform.type, false});
}